

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerouteRunner.cpp
# Opt level: O0

void __thiscall TracerouteRunner::print_output(TracerouteRunner *this)

{
  int iVar1;
  size_type sVar2;
  string local_60;
  string local_30;
  TracerouteRunner *local_10;
  TracerouteRunner *this_local;
  
  local_10 = this;
  while (((this->read_complete ^ 0xffU) & 1) != 0) {
    iVar1 = this->output_position;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->results);
    if ((ulong)(long)iVar1 < sVar2) {
      get_output_line_abi_cxx11_(&local_30,this);
      process_output(this,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  while (iVar1 = this->output_position,
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->results), (ulong)(long)iVar1 < sVar2) {
    get_output_line_abi_cxx11_(&local_60,this);
    process_output(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void TracerouteRunner::print_output() {
	while(!this->read_complete) {
		if(this->output_position < this->results.size()) {
			this->process_output(this->get_output_line());
		}
	}

	while(this->output_position < this->results.size()) {
		this->process_output(this->get_output_line());
	}
}